

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O1

Node * __thiscall Assimp::ColladaLoader::FindNode(ColladaLoader *this,Node *pNode,string *pName)

{
  size_t sVar1;
  size_t sVar2;
  pointer ppNVar3;
  int iVar4;
  Node *pNVar5;
  long lVar6;
  long lVar7;
  
  sVar1 = (pNode->mName)._M_string_length;
  sVar2 = pName->_M_string_length;
  if (((sVar1 != sVar2) ||
      ((sVar1 != 0 &&
       (iVar4 = bcmp((pNode->mName)._M_dataplus._M_p,(pName->_M_dataplus)._M_p,sVar1), iVar4 != 0)))
      ) && ((sVar1 = (pNode->mID)._M_string_length, sVar1 != sVar2 ||
            ((sVar1 != 0 &&
             (iVar4 = bcmp((pNode->mID)._M_dataplus._M_p,(pName->_M_dataplus)._M_p,sVar1),
             iVar4 != 0)))))) {
    ppNVar3 = (pNode->mChildren).
              super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar7 = (long)(pNode->mChildren).
                  super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar3;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 3;
      lVar6 = 0;
      do {
        pNVar5 = FindNode(this,ppNVar3[lVar6],pName);
        if (pNVar5 != (Node *)0x0) {
          return pNVar5;
        }
        lVar6 = lVar6 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar6);
    }
    pNode = (Node *)0x0;
  }
  return pNode;
}

Assistant:

const Collada::Node* ColladaLoader::FindNode(const Collada::Node* pNode, const std::string& pName) const
{
    if (pNode->mName == pName || pNode->mID == pName)
        return pNode;

    for (size_t a = 0; a < pNode->mChildren.size(); ++a)
    {
        const Collada::Node* node = FindNode(pNode->mChildren[a], pName);
        if (node)
            return node;
    }

    return NULL;
}